

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

bool __thiscall HighsSymmetryDetection::determineNextToDistinguish(HighsSymmetryDetection *this)

{
  vector<int_*,_std::allocator<int_*>_> *this_00;
  pointer *pppiVar1;
  int iVar2;
  pointer pNVar3;
  pointer piVar4;
  bool bVar5;
  HighsInt HVar6;
  int *in_RAX;
  int *piVar7;
  int **ppiVar8;
  long lVar9;
  int *piVar10;
  int **ppiVar11;
  iterator iVar12;
  int **ppiVar13;
  int iVar14;
  iterator i;
  long lVar15;
  int *local_38;
  
  pNVar3 = (this->nodeStack).
           super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppiVar8 = (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar12._M_current =
       (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar12._M_current != ppiVar8) {
    (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppiVar8;
    iVar12._M_current = ppiVar8;
  }
  this_00 = &this->distinguishCands;
  iVar14 = pNVar3[-1].targetCell;
  lVar9 = (long)iVar14;
  piVar4 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar10 = piVar4 + lVar9;
  iVar2 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9];
  lVar15 = (long)iVar2;
  if (pNVar3[-1].lastDistiguished == -1) {
    if ((iVar14 != iVar2) && (piVar7 = piVar10 + 1, piVar7 != piVar4 + lVar15)) {
      iVar14 = *piVar10;
      lVar9 = lVar15 * 4 + lVar9 * -4 + -4;
      do {
        if (*piVar7 < iVar14) {
          piVar10 = piVar7;
          iVar14 = *piVar7;
        }
        piVar7 = piVar7 + 1;
        lVar9 = lVar9 + -4;
      } while (lVar9 != 0);
    }
    if (iVar12._M_current !=
        (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *iVar12._M_current = piVar10;
      pppiVar1 = &(this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      *pppiVar1 = *pppiVar1 + 1;
      return true;
    }
    local_38 = piVar10;
    std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*>
              ((vector<int*,std::allocator<int*>> *)this_00,iVar12,&local_38);
    return true;
  }
  local_38 = in_RAX;
  if (this->firstPathDepth <
      (int)((ulong)((long)pNVar3 -
                   (long)(this->nodeStack).
                         super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    if (iVar14 != iVar2) {
      lVar9 = lVar15 * 4 + lVar9 * -4;
      do {
        if ((pNVar3[-1].lastDistiguished < *piVar10) &&
           (bVar5 = checkStoredAutomorphism(this,*piVar10), bVar5)) {
          iVar12._M_current =
               (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_38 = piVar10;
          if (iVar12._M_current ==
              (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*>
                      ((vector<int*,std::allocator<int*>> *)this_00,iVar12,&local_38);
          }
          else {
            *iVar12._M_current = piVar10;
            pppiVar1 = &(this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppiVar1 = *pppiVar1 + 1;
          }
        }
        piVar10 = piVar10 + 1;
        lVar9 = lVar9 + -4;
      } while (lVar9 != 0);
      ppiVar8 = (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar12._M_current =
           (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    if (ppiVar8 == iVar12._M_current) {
      return false;
    }
    ppiVar11 = ppiVar8 + 1;
    piVar10 = *ppiVar8;
    ppiVar13 = ppiVar8;
    piVar7 = piVar10;
    if (ppiVar11 == iVar12._M_current) goto LAB_002fa3a3;
    iVar14 = *piVar10;
    do {
      if (**ppiVar11 < iVar14) {
        ppiVar13 = ppiVar11;
        iVar14 = **ppiVar11;
      }
      ppiVar11 = ppiVar11 + 1;
    } while (ppiVar11 != iVar12._M_current);
  }
  else {
    if (iVar14 != iVar2) {
      lVar9 = lVar15 * 4 + lVar9 * -4;
      do {
        if ((pNVar3[-1].lastDistiguished < *piVar10) &&
           (HVar6 = getOrbit(this,*piVar10),
           (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[HVar6] == *piVar10)) {
          iVar12._M_current =
               (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_38 = piVar10;
          if (iVar12._M_current ==
              (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*>
                      ((vector<int*,std::allocator<int*>> *)this_00,iVar12,&local_38);
          }
          else {
            *iVar12._M_current = piVar10;
            pppiVar1 = &(this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppiVar1 = *pppiVar1 + 1;
          }
        }
        piVar10 = piVar10 + 1;
        lVar9 = lVar9 + -4;
      } while (lVar9 != 0);
      ppiVar8 = (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar12._M_current =
           (this->distinguishCands).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    if (ppiVar8 == iVar12._M_current) {
      return false;
    }
    ppiVar11 = ppiVar8 + 1;
    piVar10 = *ppiVar8;
    ppiVar13 = ppiVar8;
    piVar7 = piVar10;
    if (ppiVar11 == iVar12._M_current) goto LAB_002fa3a3;
    iVar14 = *piVar10;
    do {
      if (**ppiVar11 < iVar14) {
        ppiVar13 = ppiVar11;
        iVar14 = **ppiVar11;
      }
      ppiVar11 = ppiVar11 + 1;
    } while (ppiVar11 != iVar12._M_current);
  }
  piVar7 = *ppiVar13;
LAB_002fa3a3:
  *ppiVar8 = piVar7;
  *ppiVar13 = piVar10;
  std::vector<int_*,_std::allocator<int_*>_>::resize(this_00,1);
  return true;
}

Assistant:

bool HighsSymmetryDetection::determineNextToDistinguish() {
  Node& currNode = nodeStack.back();
  distinguishCands.clear();
  std::vector<HighsInt>::iterator cellStart;
  std::vector<HighsInt>::iterator cellEnd;
  cellStart = currentPartition.begin() + currNode.targetCell;
  cellEnd =
      currentPartition.begin() + currentPartitionLinks[currNode.targetCell];

  if (currNode.lastDistiguished == -1) {
    auto nextDistinguishPos = std::min_element(cellStart, cellEnd);
    distinguishCands.push_back(&*nextDistinguishPos);
  } else if ((HighsInt)nodeStack.size() > firstPathDepth) {
    for (auto i = cellStart; i != cellEnd; ++i) {
      if (*i > currNode.lastDistiguished && checkStoredAutomorphism(*i))
        distinguishCands.push_back(&*i);
    }
    if (distinguishCands.empty()) return false;
    auto nextDistinguishPos =
        std::min_element(distinguishCands.begin(), distinguishCands.end(),
                         [](HighsInt* a, HighsInt* b) { return *a < *b; });
    std::swap(*distinguishCands.begin(), *nextDistinguishPos);
    distinguishCands.resize(1);
  } else {
    for (auto i = cellStart; i != cellEnd; ++i) {
      if (*i > currNode.lastDistiguished && vertexGroundSet[getOrbit(*i)] == *i)
        distinguishCands.push_back(&*i);
    }
    if (distinguishCands.empty()) return false;
    auto nextDistinguishPos =
        std::min_element(distinguishCands.begin(), distinguishCands.end(),
                         [](HighsInt* a, HighsInt* b) { return *a < *b; });
    std::swap(*distinguishCands.begin(), *nextDistinguishPos);
    distinguishCands.resize(1);
  }

  return true;
}